

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void backpressure_set_one(CManager_conflict cm,source_info *info)

{
  event_path_data evp;
  void *pvVar1;
  stone_type p_Var2;
  stone_type p_Var3;
  int iVar4;
  _proto_action *p_Var5;
  uchar type;
  anon_union_8_2_a7896871_for_u conn;
  
  evp = cm->evp;
  pvVar1 = evp->as;
  if (*(int *)((long)pvVar1 + 4) < 0) {
    __assert_fail("as->events_in_play >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                  ,0xb85,"void backpressure_set_one(CManager, struct source_info *)");
  }
  p_Var2 = stone_struct(evp,info->to_stone);
  p_Var3 = stone_struct(evp,info->stone);
  if (info->type == SOURCE_REMOTE) {
    iVar4 = p_Var3->squelch_depth;
    if (p_Var2->is_stalled == 0) {
      p_Var3->squelch_depth = iVar4 + -1;
      if (iVar4 + -1 == 0) {
        conn = info->u;
        iVar4 = info->stone;
        type = '\x01';
        goto LAB_001357ec;
      }
    }
    else {
      p_Var3->squelch_depth = iVar4 + 1;
      if (iVar4 == 0) {
        conn = info->u;
        iVar4 = info->stone;
        type = '\0';
LAB_001357ec:
        INT_CMwrite_evcontrol((CMConnection)conn,type,iVar4);
        return;
      }
    }
  }
  else if (info->type == SOURCE_ACTION) {
    p_Var5 = p_Var3->proto_actions + (info->u).action.action;
    if ((info->u).action.would_recurse != 0) {
      if (p_Var2->is_stalled == 0) {
        printf("recurse unstall %d\n",(ulong)(uint)info->stone);
        do_backpressure_unstall_callbacks(cm,info->stone);
      }
      else {
        printf("recurse stall %d\n",(ulong)(uint)info->stone);
        p_Var3->is_stalled = 1;
      }
      backpressure_transition(cm,info->stone,Stall_Upstream,p_Var2->is_stalled);
    }
    if (((p_Var5->action_type == Action_Store) &&
        (iVar4 = p_Var2->is_stalled, (p_Var5->o).store.is_paused != iVar4)) &&
       ((p_Var5->o).store.is_paused = iVar4, (p_Var5->o).bri.remote_stone_id != 0)) {
      if (iVar4 == 0) {
        *(int *)((long)pvVar1 + 4) = *(int *)((long)pvVar1 + 4) + 1;
        p_Var3->pending_output = p_Var3->pending_output + 1;
        INT_CMadd_delayed_task(cm,0,0,deferred_process_actions,(void *)0x0);
        return;
      }
      *(int *)((long)pvVar1 + 4) = *(int *)((long)pvVar1 + 4) + -1;
      p_Var3->pending_output = p_Var3->pending_output + -1;
    }
  }
  return;
}

Assistant:

static void
backpressure_set_one(CManager cm, struct source_info *info)
{
    event_path_data evp = cm->evp;
    action_state as = evp->as;
    assert(as->events_in_play >= 0);
    int s = info->to_stone;
    stone_type to_stone = stone_struct(evp,s);
    stone_type stone = stone_struct(evp, info->stone);
    switch (info->type) {
    case SOURCE_ACTION: {
            proto_action *act = &stone->proto_actions[info->u.action.action];
            
            if (info->u.action.would_recurse) {
                /* If we might be stalling the stone that has sources, we mark it as stalled before
                 * calling * backpressure_transition() because we are already recursing to its sources
                 * and performing actions as if the stone is stalled. If the stone unstalls
                 * as a result of the transition, we do want to do the recursive search
                 * since we do not recurse through stalled stones (though we do set would_recurse
                 * for them). 
                 */
                if (to_stone->is_stalled) {
                    printf("recurse stall %d\n", info->stone);
                    stone->is_stalled = 1;
                } else {
                    printf("recurse unstall %d\n", info->stone);
                    do_backpressure_unstall_callbacks(cm, info->stone);
                }
                /* TODO for, e.g., split stones check that we should actually unstall it 
                 * (maybe just count our upstream stall depth?) 
                 */
                backpressure_transition(cm, info->stone, Stall_Upstream, to_stone->is_stalled);
            }
            switch (act->action_type) {
            case Action_Store:
                {
                    struct storage_proto_vals *store = &act->o.store;
                    if (store->is_paused != to_stone->is_stalled) {
                        store->is_paused = to_stone->is_stalled;
                        if (store->is_sending) {
                            if (store->is_paused) {
                                --as->events_in_play;
                                --stone->pending_output;
                            } else {
                                ++as->events_in_play;
                                ++stone->pending_output;
                                (void) INT_CMadd_delayed_task(cm, 0, 0, deferred_process_actions, NULL);
                            }
                        }
                    }
                }
                break;
            default:;
                /* printf("unhandled action %d\n", act->action_type); */
                /* TODO more cases? */
            }
        }
        break;
    case SOURCE_REMOTE: {
            if (to_stone->is_stalled) {
                if (stone->squelch_depth++ == 0) {
                    INT_CMwrite_evcontrol(info->u.remote.conn, CONTROL_SQUELCH, info->stone);
                }
            } else if (0 == --stone->squelch_depth) {
                INT_CMwrite_evcontrol(info->u.remote.conn, CONTROL_UNSQUELCH, info->stone);
            }
        }
        break;
    default:
        /* XXX */
        ;
    }
}